

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebTools.cpp
# Opt level: O0

ArrayXd __thiscall ChebTools::ChebyshevExpansion::to_monomial_increasing(ChebyshevExpansion *this)

{
  Scalar SVar1;
  vectype *pvVar2;
  Scalar *pSVar3;
  Index extraout_RDX;
  ChebyshevExpansion *in_RSI;
  ArrayXd AVar4;
  Type local_d0;
  Array<double,__1,_1,_0,__1,_1> local_98;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>
  local_88;
  int local_58;
  int i;
  Index local_48;
  undefined1 local_39;
  long local_38;
  Index N;
  undefined1 local_28 [8];
  ArrayXd c;
  ChebyshevExpansion *this_local;
  ArrayXd *out;
  
  pvVar2 = coef(in_RSI);
  Eigen::Array<double,-1,1,0,-1,1>::Array<Eigen::Matrix<double,_1,1,0,_1,1>>
            ((Array<double,_1,1,0,_1,1> *)local_28,pvVar2);
  local_48 = Eigen::EigenBase<Eigen::Array<double,_-1,_1,_0,_-1,_1>_>::size
                       ((EigenBase<Eigen::Array<double,__1,_1,_0,__1,_1>_> *)local_28);
  local_38 = local_48 + -1;
  local_39 = 0;
  Eigen::Array<double,_-1,_1,_0,_-1,_1>::Array<long>
            ((Array<double,__1,_1,_0,__1,_1> *)this,&local_48);
  Eigen::DenseBase<Eigen::Array<double,_-1,_1,_0,_-1,_1>_>::setZero
            ((DenseBase<Eigen::Array<double,__1,_1,_0,__1,_1>_> *)this);
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Array<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Array<double,__1,_1,_0,__1,_1>,_1> *)local_28,0);
  SVar1 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Array<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Array<double,__1,_1,_0,__1,_1>,_1> *)this,0);
  *pSVar3 = SVar1;
  for (local_58 = 1; local_58 <= local_38; local_58 = local_58 + 1) {
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Array<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Array<double,__1,_1,_0,__1,_1>,_1> *)local_28,
                        (long)local_58);
    get_monomial_from_Cheb_basis((int)&local_98);
    Eigen::operator*(&local_88,pSVar3,(StorageBaseType *)&local_98);
    Eigen::DenseBase<Eigen::Array<double,_-1,_1,_0,_-1,_1>_>::head<int>
              (&local_d0,(DenseBase<Eigen::Array<double,__1,_1,_0,__1,_1>_> *)this,local_58 + 1);
    Eigen::ArrayBase<Eigen::Block<Eigen::Array<double,-1,1,0,-1,1>,-1,1,false>>::operator+=
              ((ArrayBase<Eigen::Block<Eigen::Array<double,_1,1,0,_1,1>,_1,1,false>> *)&local_d0,
               (ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>_>
                *)&local_88);
    Eigen::Array<double,_-1,_1,_0,_-1,_1>::~Array(&local_98);
  }
  local_39 = 1;
  Eigen::Array<double,_-1,_1,_0,_-1,_1>::~Array((Array<double,__1,_1,_0,__1,_1> *)local_28);
  AVar4.super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       extraout_RDX;
  AVar4.super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)this;
  return (ArrayXd)AVar4.super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

Eigen::ArrayXd ChebyshevExpansion::to_monomial_increasing() const {
        Eigen::ArrayXd c = coef();
        Eigen::Index N = c.size() - 1; // N is the degree of A
        Eigen::ArrayXd out(N+1); out.setZero();
        out[0] = c[0];
        for (auto i = 1; i <= N; ++i){
            out.head(i+1) += c(i)*get_monomial_from_Cheb_basis(i);
        }
        return out;
    }